

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.c
# Opt level: O1

void do_alias(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  char *pcVar5;
  CHAR_DATA *ch_00;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string buffer;
  char arg [4608];
  char buf [4608];
  string local_2498;
  char *local_2478;
  undefined8 local_2470;
  char local_2468;
  undefined7 uStack_2467;
  char *local_2458 [2];
  char *local_2448;
  char local_2438 [4608];
  char local_1238 [4616];
  
  local_2470 = 0;
  local_2468 = '\0';
  local_2478 = &local_2468;
  smash_tilde(argument);
  ch_00 = ch;
  if ((ch->desc != (DESCRIPTOR_DATA *)0x0) &&
     (ch_00 = ch->desc->original, ch_00 == (CHAR_DATA *)0x0)) {
    ch_00 = ch;
  }
  bVar1 = is_npc(ch_00);
  if (!bVar1) {
    pcVar2 = one_argument(argument,local_2438);
    if (local_2438[0] == '\0') {
      if (ch_00->pcdata->alias[0] != (char *)0x0) {
        send_to_char("Your current aliases are:\n\r",ch);
        lVar4 = -10;
        do {
          if ((ch_00->pcdata->alias_sub[lVar4] == (char *)0x0) ||
             (ch_00->pcdata->color_scheme[lVar4 + -7] == (char *)0x0)) break;
          sprintf(local_1238,"    %s:  %s\n\r");
          send_to_char(local_1238,ch);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0);
        goto LAB_00278938;
      }
      pcVar5 = "You have no aliases defined.\n\r";
    }
    else {
      bVar1 = str_prefix("una",local_2438);
      pcVar5 = "Sorry, that word is reserved.\n\r";
      if ((bVar1) && (bVar1 = str_cmp("alias",local_2438), bVar1)) {
        if (*pcVar2 == '\0') {
          lVar4 = -10;
          pcVar5 = "That alias is not defined.\n\r";
          do {
            pcVar2 = ch_00->pcdata->alias_sub[lVar4];
            if ((pcVar2 == (char *)0x0) || (ch_00->pcdata->color_scheme[lVar4 + -7] == (char *)0x0))
            break;
            bVar1 = str_cmp(local_2438,pcVar2);
            if (!bVar1) {
              pcVar5 = local_1238;
              sprintf(pcVar5,"%s aliases to \'%s\'.\n\r",ch_00->pcdata->alias_sub[lVar4],
                      ch_00->pcdata->color_scheme[lVar4 + -7]);
              break;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0);
        }
        else {
          bVar1 = str_prefix(pcVar2,"delete");
          pcVar5 = "That shall not be done!\n\r";
          if ((bVar1) && (bVar1 = str_prefix(pcVar2,"prefix"), bVar1)) {
            uVar3 = 0;
            do {
              pcVar5 = ch_00->pcdata->alias[uVar3];
              if (pcVar5 == (char *)0x0) goto LAB_0027889e;
              bVar1 = str_cmp(local_2438,pcVar5);
              if (!bVar1) {
                free_pstring(ch_00->pcdata->alias_sub[uVar3]);
                pcVar5 = palloc_string(pcVar2);
                ch_00->pcdata->alias_sub[uVar3] = pcVar5;
                fmt_00.size_ = 0xcc;
                fmt_00.data_ = (char *)0x1e;
                args_00.field_1.args_ = in_R9.args_;
                args_00.desc_ = (unsigned_long_long)local_2458;
                local_2458[0] = local_2438;
                local_2448 = pcVar2;
                ::fmt::v9::vformat_abi_cxx11_
                          (&local_2498,(v9 *)"{} is now realiased to \'{}\'.\n\r",fmt_00,args_00);
                goto LAB_00278a87;
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 != 10);
            uVar3 = 10;
LAB_0027889e:
            if ((uint)uVar3 < 10) {
              pcVar5 = palloc_string(local_2438);
              ch_00->pcdata->alias[uVar3 & 0xffffffff] = pcVar5;
              pcVar5 = palloc_string(pcVar2);
              ch_00->pcdata->alias_sub[uVar3 & 0xffffffff] = pcVar5;
              fmt.size_ = 0xcc;
              fmt.data_ = (char *)0x1c;
              args.field_1.args_ = in_R9.args_;
              args.desc_ = (unsigned_long_long)local_2458;
              local_2458[0] = local_2438;
              local_2448 = pcVar2;
              ::fmt::v9::vformat_abi_cxx11_
                        (&local_2498,(v9 *)"{} is now aliased to \'{}\'.\n\r",fmt,args);
LAB_00278a87:
              std::__cxx11::string::operator=((string *)&local_2478,(string *)&local_2498);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2498._M_dataplus._M_p != &local_2498.field_2) {
                operator_delete(local_2498._M_dataplus._M_p,
                                local_2498.field_2._M_allocated_capacity + 1);
              }
              send_to_char(local_2478,ch);
              goto LAB_00278938;
            }
            pcVar5 = "Sorry, you have reached the alias limit.\n\r";
          }
        }
      }
    }
    send_to_char(pcVar5,ch);
  }
LAB_00278938:
  if (local_2478 != &local_2468) {
    operator_delete(local_2478,CONCAT71(uStack_2467,local_2468) + 1);
  }
  return;
}

Assistant:

void do_alias(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *rch;
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	std::string buffer;
	int pos;
	smash_tilde(argument);

	if (ch->desc == nullptr)
		rch = ch;
	else
		rch = ch->desc->original ? ch->desc->original : ch;

	if (is_npc(rch))
		return;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		if (rch->pcdata->alias[0] == nullptr)
		{
			send_to_char("You have no aliases defined.\n\r", ch);
			return;
		}

		send_to_char("Your current aliases are:\n\r", ch);

		for (pos = 0; pos < MAX_ALIAS; pos++)
		{
			if (rch->pcdata->alias[pos] == nullptr || rch->pcdata->alias_sub[pos] == nullptr)
				break;

			sprintf(buf, "    %s:  %s\n\r", rch->pcdata->alias[pos], rch->pcdata->alias_sub[pos]);
			send_to_char(buf, ch);
		}

		return;
	}

	if (!str_prefix("una", arg) || !str_cmp("alias", arg))
	{
		send_to_char("Sorry, that word is reserved.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		for (pos = 0; pos < MAX_ALIAS; pos++)
		{
			if (rch->pcdata->alias[pos] == nullptr || rch->pcdata->alias_sub[pos] == nullptr)
				break;

			if (!str_cmp(arg, rch->pcdata->alias[pos]))
			{
				sprintf(buf, "%s aliases to '%s'.\n\r", rch->pcdata->alias[pos], rch->pcdata->alias_sub[pos]);
				send_to_char(buf, ch);
				return;
			}
		}

		send_to_char("That alias is not defined.\n\r", ch);
		return;
	}

	if (!str_prefix(argument, "delete") || !str_prefix(argument, "prefix"))
	{
		send_to_char("That shall not be done!\n\r", ch);
		return;
	}

	for (pos = 0; pos < MAX_ALIAS; pos++)
	{
		if (rch->pcdata->alias[pos] == nullptr)
			break;

		if (!str_cmp(arg, rch->pcdata->alias[pos])) /* redefine an alias */
		{
			free_pstring(rch->pcdata->alias_sub[pos]);
			rch->pcdata->alias_sub[pos] = palloc_string(argument);

			buffer = fmt::format("{} is now realiased to '{}'.\n\r", arg, argument); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);
			return;
		}
	}

	if (pos >= MAX_ALIAS)
	{
		send_to_char("Sorry, you have reached the alias limit.\n\r", ch);
		return;
	}

	/* make a new alias */
	rch->pcdata->alias[pos] = palloc_string(arg);
	rch->pcdata->alias_sub[pos] = palloc_string(argument);

	buffer = fmt::format("{} is now aliased to '{}'.\n\r", arg, argument);
	send_to_char(buffer.c_str(), ch);
}